

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall QStyleSheetStyle::repolish(QStyleSheetStyle *this,QWidget *w)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QList<const_QObject_*> local_58;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (QObject **)0x0;
  local_58.d.size = 0;
  QList<const_QObject_*>::reserve(&local_58,*(long *)(*(long *)&w->field_0x8 + 0x28) + 1);
  lVar1 = *(long *)(*(long *)&w->field_0x8 + 0x28);
  if (lVar1 != 0) {
    lVar2 = *(long *)(*(long *)&w->field_0x8 + 0x20);
    lVar3 = 0;
    do {
      local_40 = *(QWidget **)(lVar2 + lVar3);
      QtPrivate::QPodArrayOps<QObject_const*>::emplace<QObject_const*&>
                ((QPodArrayOps<QObject_const*> *)&local_58,local_58.d.size,(QObject **)&local_40);
      QList<const_QObject_*>::end(&local_58);
      lVar3 = lVar3 + 8;
    } while (lVar1 << 3 != lVar3);
  }
  local_40 = w;
  QtPrivate::QPodArrayOps<QObject_const*>::emplace<QObject_const*&>
            ((QPodArrayOps<QObject_const*> *)&local_58,local_58.d.size,(QObject **)&local_40);
  QList<const_QObject_*>::end(&local_58);
  local_40 = w;
  QHash<void_const*,QCss::StyleSheet>::removeImpl<void_const*>
            ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,&local_40);
  updateObjects(&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::repolish(QWidget *w)
{
    QList<const QObject *> children;
    children.reserve(w->children().size() + 1);
    for (auto child: std::as_const(w->children()))
        children.append(child);
    children.append(w);
    styleSheetCaches->styleSheetCache.remove(w);
    updateObjects(children);
}